

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode Curl_readrewind(connectdata *conn)

{
  Curl_easy *data_00;
  long *plVar1;
  CURLcode CVar2;
  uint uVar3;
  curlioerr cVar4;
  int iVar5;
  curlioerr err_1;
  int err;
  HTTP *http;
  curl_mimepart *mimepart;
  Curl_easy *data;
  connectdata *conn_local;
  
  data_00 = conn->data;
  http = (HTTP *)&(data_00->set).mimepost;
  (conn->bits).rewindaftersend = false;
  (data_00->req).keepon = (data_00->req).keepon & 0xfffffffd;
  if (((conn->handler->protocol & 3) != 0) && (plVar1 = (long *)(data_00->req).protop, *plVar1 != 0)
     ) {
    http = (HTTP *)*plVar1;
  }
  if ((data_00->set).postfields == (void *)0x0) {
    if (((data_00->set).httpreq == HTTPREQ_POST_MIME) ||
       ((data_00->set).httpreq == HTTPREQ_POST_FORM)) {
      CVar2 = Curl_mime_rewind((curl_mimepart *)http);
      if (CVar2 != CURLE_OK) {
        Curl_failf(data_00,"Cannot rewind mime/post data");
        return CURLE_SEND_FAIL_REWIND;
      }
    }
    else if ((data_00->set).seek_func == (curl_seek_callback)0x0) {
      if ((data_00->set).ioctl_func == (curl_ioctl_callback)0x0) {
        if (((data_00->state).fread_func == fread) &&
           (iVar5 = fseek((FILE *)(data_00->state).in,0,0), iVar5 != -1)) {
          return CURLE_OK;
        }
        Curl_failf(data_00,"necessary data rewind wasn\'t possible");
        return CURLE_SEND_FAIL_REWIND;
      }
      Curl_set_in_callback(data_00,true);
      cVar4 = (*(data_00->set).ioctl_func)(data_00,1,(data_00->set).ioctl_client);
      Curl_set_in_callback(data_00,false);
      Curl_infof(data_00,"the ioctl callback returned %d\n",(ulong)cVar4);
      if (cVar4 != CURLIOE_OK) {
        Curl_failf(data_00,"ioctl callback returned error %d",(ulong)cVar4);
        return CURLE_SEND_FAIL_REWIND;
      }
    }
    else {
      Curl_set_in_callback(data_00,true);
      uVar3 = (*(data_00->set).seek_func)((data_00->set).seek_client,0,0);
      Curl_set_in_callback(data_00,false);
      if (uVar3 != 0) {
        Curl_failf(data_00,"seek callback returned error %d",(ulong)uVar3);
        return CURLE_SEND_FAIL_REWIND;
      }
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_readrewind(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  curl_mimepart *mimepart = &data->set.mimepost;

  conn->bits.rewindaftersend = FALSE; /* we rewind now */

  /* explicitly switch off sending data on this connection now since we are
     about to restart a new transfer and thus we want to avoid inadvertently
     sending more data on the existing connection until the next transfer
     starts */
  data->req.keepon &= ~KEEP_SEND;

  /* We have sent away data. If not using CURLOPT_POSTFIELDS or
     CURLOPT_HTTPPOST, call app to rewind
  */
  if(conn->handler->protocol & PROTO_FAMILY_HTTP) {
    struct HTTP *http = data->req.protop;

    if(http->sendit)
      mimepart = http->sendit;
  }
  if(data->set.postfields)
    ; /* do nothing */
  else if(data->set.httpreq == HTTPREQ_POST_MIME ||
          data->set.httpreq == HTTPREQ_POST_FORM) {
    if(Curl_mime_rewind(mimepart)) {
      failf(data, "Cannot rewind mime/post data");
      return CURLE_SEND_FAIL_REWIND;
    }
  }
  else {
    if(data->set.seek_func) {
      int err;

      Curl_set_in_callback(data, true);
      err = (data->set.seek_func)(data->set.seek_client, 0, SEEK_SET);
      Curl_set_in_callback(data, false);
      if(err) {
        failf(data, "seek callback returned error %d", (int)err);
        return CURLE_SEND_FAIL_REWIND;
      }
    }
    else if(data->set.ioctl_func) {
      curlioerr err;

      Curl_set_in_callback(data, true);
      err = (data->set.ioctl_func)(data, CURLIOCMD_RESTARTREAD,
                                   data->set.ioctl_client);
      Curl_set_in_callback(data, false);
      infof(data, "the ioctl callback returned %d\n", (int)err);

      if(err) {
        /* FIXME: convert to a human readable error message */
        failf(data, "ioctl callback returned error %d", (int)err);
        return CURLE_SEND_FAIL_REWIND;
      }
    }
    else {
      /* If no CURLOPT_READFUNCTION is used, we know that we operate on a
         given FILE * stream and we can actually attempt to rewind that
         ourselves with fseek() */
      if(data->state.fread_func == (curl_read_callback)fread) {
        if(-1 != fseek(data->state.in, 0, SEEK_SET))
          /* successful rewind */
          return CURLE_OK;
      }

      /* no callback set or failure above, makes us fail at once */
      failf(data, "necessary data rewind wasn't possible");
      return CURLE_SEND_FAIL_REWIND;
    }
  }
  return CURLE_OK;
}